

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedUsageCase1::Run(AdvancedUsageCase1 *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  float fVar3;
  ShaderStorageBufferObjectBase *this_01;
  float fVar4;
  float fVar5;
  float in_XMM2_Da;
  long lStackY_190;
  GLsizei count [4];
  vec3 local_158;
  vec3 local_148;
  mat4 data [4];
  
  fVar3 = 1.4013e-45;
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,1)
  ;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)data,
               "\nlayout(location = 0) in vec4 g_position;\nlayout(location = 1) in int g_object_id;\nout StageData {\n  flat int object_id;\n} g_vs_out;\nlayout(binding = 0, std430) buffer TransformBuffer {\n  mat4 g_transform[];\n};\nvoid main() {\n  mat4 mvp = g_transform[g_object_id];\n  gl_Position = mvp * g_position;\n  g_vs_out.object_id = g_object_id;\n}"
               ,(allocator<char> *)&local_148);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)count,
               "\nin StageData {\n  flat int object_id;\n} g_fs_in;\nlayout(location = 0) out vec4 g_fs_out;\nstruct Material {\n  vec3 color;\n};\nlayout(binding = 1, std430) buffer MaterialBuffer {\n  Material g_material[4];\n};\nlayout(binding = 2, std430) buffer MaterialIDBuffer {\n  int g_material_id[4];\n};\nvoid main() {\n  int mid = g_material_id[g_fs_in.object_id];\n  Material m = g_material[mid];\n  g_fs_out = vec4(m.color, 1);\n}"
               ,(allocator<char> *)&local_158);
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,(string *)data,(string *)count);
    this->m_program = GVar2;
    std::__cxx11::string::~string((string *)count);
    std::__cxx11::string::~string((string *)data);
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar1) {
      fVar4 = 4.2039e-45;
      this_01 = (ShaderStorageBufferObjectBase *)0x3;
      glu::CallLogWrapper::glGenBuffers(this_00,3,this->m_storage_buffer);
      ShaderStorageBufferObjectBase::Translation(data,this_01,-0.5,-0.5,in_XMM2_Da);
      ShaderStorageBufferObjectBase::Translation(data + 1,this_01,0.5,-0.5,in_XMM2_Da);
      ShaderStorageBufferObjectBase::Translation(data + 2,this_01,-0.5,0.5,in_XMM2_Da);
      ShaderStorageBufferObjectBase::Translation(data + 3,this_01,0.5,0.5,in_XMM2_Da);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x100,data,0x88e4);
      data[0].m_data.m_data[0].m_data[0] = 1.0;
      data[0].m_data.m_data[0].m_data[1] = 0.0;
      data[0].m_data.m_data[0].m_data[2] = 0.0;
      data[0].m_data.m_data[0].m_data[3] = 1.0;
      data[0].m_data.m_data[1].m_data[0] = 0.0;
      data[0].m_data.m_data[1].m_data[1] = 1.0;
      data[0].m_data.m_data[1].m_data[2] = 0.0;
      data[0].m_data.m_data[1].m_data[3] = 1.0;
      data[0].m_data.m_data[2].m_data[0] = 0.0;
      data[0].m_data.m_data[2].m_data[1] = 0.0;
      data[0].m_data.m_data[2].m_data[2] = 1.0;
      data[0].m_data.m_data[2].m_data[3] = 0.0;
      data[0].m_data.m_data[3].m_data[0] = 1.0;
      data[0].m_data.m_data[3].m_data[1] = 1.0;
      data[0].m_data.m_data[3].m_data[2] = 0.0;
      data[0].m_data.m_data[3].m_data[3] = 1.0;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x40,data,0x88e4);
      data[0].m_data.m_data[0].m_data[0] = 0.0;
      data[0].m_data.m_data[0].m_data[1] = 1.4013e-45;
      data[0].m_data.m_data[0].m_data[2] = 2.8026e-45;
      data[0].m_data.m_data[0].m_data[3] = 4.2039e-45;
      fVar5 = 2.8026e-45;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,this->m_storage_buffer[2]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,data,0x88e4);
      data[0].m_data.m_data[0].m_data[0] = -0.4;
      data[0].m_data.m_data[0].m_data[1] = -0.4;
      data[0].m_data.m_data[0].m_data[2] = 0.0;
      data[0].m_data.m_data[0].m_data[3] = 0.4;
      data[0].m_data.m_data[1].m_data[0] = -0.4;
      data[0].m_data.m_data[1].m_data[1] = 0.0;
      data[0].m_data.m_data[1].m_data[2] = -0.4;
      data[0].m_data.m_data[1].m_data[3] = 0.4;
      data[0].m_data.m_data[2].m_data[0] = 0.0;
      data[0].m_data.m_data[2].m_data[1] = 0.4;
      data[0].m_data.m_data[2].m_data[2] = 0.4;
      data[0].m_data.m_data[2].m_data[3] = 0.0;
      data[0].m_data.m_data[3].m_data[0] = -0.4;
      data[0].m_data.m_data[3].m_data[1] = -0.4;
      data[0].m_data.m_data[3].m_data[3] = 0.4;
      data[1].m_data.m_data[0].m_data[0] = -0.4;
      data[1].m_data.m_data[0].m_data[2] = -0.4;
      data[1].m_data.m_data[0].m_data[3] = 0.4;
      data[1].m_data.m_data[1].m_data[1] = 0.4;
      data[1].m_data.m_data[1].m_data[2] = 0.4;
      data[1].m_data.m_data[2].m_data[0] = -0.4;
      data[1].m_data.m_data[2].m_data[1] = -0.4;
      data[1].m_data.m_data[2].m_data[3] = 0.4;
      data[1].m_data.m_data[3].m_data[0] = -0.4;
      data[1].m_data.m_data[3].m_data[2] = -0.4;
      data[1].m_data.m_data[3].m_data[3] = 0.4;
      data[2].m_data.m_data[0].m_data[1] = 0.4;
      data[2].m_data.m_data[0].m_data[2] = 0.4;
      data[2].m_data.m_data[1].m_data[0] = -0.4;
      data[2].m_data.m_data[1].m_data[1] = -0.4;
      data[2].m_data.m_data[1].m_data[3] = 0.4;
      data[2].m_data.m_data[2].m_data[0] = -0.4;
      data[2].m_data.m_data[2].m_data[2] = -0.4;
      data[2].m_data.m_data[2].m_data[3] = 0.4;
      data[2].m_data.m_data[3].m_data[1] = 0.4;
      data[2].m_data.m_data[3].m_data[2] = 0.4;
      data[0].m_data.m_data[3].m_data[2] = fVar3;
      data[1].m_data.m_data[0].m_data[1] = fVar3;
      data[1].m_data.m_data[1].m_data[0] = fVar3;
      data[1].m_data.m_data[1].m_data[3] = fVar3;
      data[1].m_data.m_data[2].m_data[2] = fVar5;
      data[1].m_data.m_data[3].m_data[1] = fVar5;
      data[2].m_data.m_data[0].m_data[0] = fVar5;
      data[2].m_data.m_data[0].m_data[3] = fVar5;
      data[2].m_data.m_data[1].m_data[2] = fVar4;
      data[2].m_data.m_data[2].m_data[1] = fVar4;
      data[2].m_data.m_data[3].m_data[0] = fVar4;
      data[2].m_data.m_data[3].m_data[3] = fVar4;
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x8892,0xc0,data,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_rt);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
      glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8058,100,100);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
      glu::CallLogWrapper::glViewport(this_00,0,0,100,100);
      glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_fbo);
      glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,this->m_rt,0);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0xc,(void *)0x0);
      glu::CallLogWrapper::glVertexAttribIPointer(this_00,1,1,0x1404,0xc,(void *)0x8);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
      glu::CallLogWrapper::glBindVertexArray(this_00,0);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      data[0].m_data.m_data[0].m_data[0] = 0.0;
      data[0].m_data.m_data[0].m_data[1] = 5.60519e-45;
      data[0].m_data.m_data[0].m_data[2] = 1.12104e-44;
      data[0].m_data.m_data[0].m_data[3] = 1.68156e-44;
      count[0] = 4;
      count[1] = 4;
      count[2] = 4;
      count[3] = 4;
      glu::CallLogWrapper::glMultiDrawArrays(this_00,5,(GLint *)data,count,4);
      data[0].m_data.m_data[0].m_data[0] = 1.0;
      data[0].m_data.m_data[0].m_data[1] = 0.0;
      data[0].m_data.m_data[0].m_data[2] = 0.0;
      count[0] = 0;
      count[1] = 0x3f800000;
      count._8_8_ = count._8_8_ & 0xffffffff00000000;
      local_148.m_data[0] = 1.0;
      local_148.m_data[1] = 1.0;
      local_148.m_data[2] = 0.0;
      local_158.m_data[0] = 0.0;
      local_158.m_data[1] = 0.0;
      local_158.m_data[2] = 1.0;
      bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                        (&this->super_ShaderStorageBufferObjectBase,(vec3 *)data,(vec3 *)count,
                         &local_148,&local_158,(int *)0x0);
      lStackY_190 = (ulong)bVar1 - 1;
    }
    else {
      lStackY_190 = -1;
    }
  }
  else {
    lStackY_190 = 0x10;
  }
  return lStackY_190;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_position;" NL "layout(location = 1) in int g_object_id;" NL
			   "out StageData {" NL "  flat int object_id;" NL "} g_vs_out;" NL
			   "layout(binding = 0, std430) buffer TransformBuffer {" NL "  mat4 g_transform[];" NL "};" NL
			   "void main() {" NL "  mat4 mvp = g_transform[g_object_id];" NL "  gl_Position = mvp * g_position;" NL
			   "  g_vs_out.object_id = g_object_id;" NL "}";

		const char* const glsl_fs = NL
			"in StageData {" NL "  flat int object_id;" NL "} g_fs_in;" NL "layout(location = 0) out vec4 g_fs_out;" NL
			"struct Material {" NL "  vec3 color;" NL "};" NL "layout(binding = 1, std430) buffer MaterialBuffer {" NL
			"  Material g_material[4];" NL "};" NL "layout(binding = 2, std430) buffer MaterialIDBuffer {" NL
			"  int g_material_id[4];" NL "};" NL "void main() {" NL "  int mid = g_material_id[g_fs_in.object_id];" NL
			"  Material m = g_material[mid];" NL "  g_fs_out = vec4(m.color, 1);" NL "}";

		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(3, m_storage_buffer);

		/* transform buffer */
		{
			mat4 data[] = { Translation(-0.5f, -0.5f, 0.0f), Translation(0.5f, -0.5f, 0.0f),
							Translation(-0.5f, 0.5f, 0.0f), Translation(0.5f, 0.5f, 0.0f) };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		/* material buffer */
		{
			vec4 data[] = { vec4(1, 0, 0, 1), vec4(0, 1, 0, 1), vec4(0, 0, 1, 0), vec4(1, 1, 0, 1) };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		/* material id buffer */
		{
			int data[] = { 0, 1, 2, 3 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		/* vertex buffer */
		{
			struct
			{
				vec2 position;
				int  object_id;
			} data[] = { { vec2(-0.4f, -0.4f), 0 }, { vec2(0.4f, -0.4f), 0 },  { vec2(-0.4f, 0.4f), 0 },
						 { vec2(0.4f, 0.4f), 0 },   { vec2(-0.4f, -0.4f), 1 }, { vec2(0.4f, -0.4f), 1 },
						 { vec2(-0.4f, 0.4f), 1 },  { vec2(0.4f, 0.4f), 1 },   { vec2(-0.4f, -0.4f), 2 },
						 { vec2(0.4f, -0.4f), 2 },  { vec2(-0.4f, 0.4f), 2 },  { vec2(0.4f, 0.4f), 2 },
						 { vec2(-0.4f, -0.4f), 3 }, { vec2(0.4f, -0.4f), 3 },  { vec2(-0.4f, 0.4f), 3 },
						 { vec2(0.4f, 0.4f), 3 } };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glBindTexture(GL_TEXTURE_2D, m_rt);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 100, 100);
		glBindTexture(GL_TEXTURE_2D, 0);
		glViewport(0, 0, 100, 100);
		glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_rt, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, sizeof(vec2) + sizeof(int), 0);
		glVertexAttribIPointer(1, 1, GL_INT, sizeof(vec2) + sizeof(int), reinterpret_cast<void*>(sizeof(vec2)));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		/* draw */
		{
			const GLint   first[4] = { 0, 4, 8, 12 };
			const GLsizei count[4] = { 4, 4, 4, 4 };
			glMultiDrawArrays(GL_TRIANGLE_STRIP, first, count, 4);
		}
		if (!ValidateWindow4Quads(vec3(1, 0, 0), vec3(0, 1, 0), vec3(1, 1, 0), vec3(0, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}